

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-help.c
# Opt level: O2

_Bool show_file(char *name,char *what,int line,int mode)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  long lVar8;
  size_t sVar9;
  char *pcVar10;
  ushort **ppuVar11;
  int iVar12;
  char *pcVar13;
  undefined8 extraout_RDX;
  char *pcVar14;
  keycode_t kVar15;
  bool bVar16;
  ulong uVar17;
  wchar_t wVar18;
  ulong uVar19;
  undefined1 uVar20;
  byte bVar21;
  keypress kVar22;
  ulong uStack_1540;
  int hgt;
  char *local_1528;
  size_t local_1520;
  ang_file *local_1518;
  uint local_1510;
  wchar_t local_150c;
  ulong local_1508;
  ulong local_1500;
  int local_14f8;
  uint local_14f4;
  int local_14f0;
  int wid;
  char ftmp [80];
  char shower [80];
  char finder [80];
  char caption [128];
  char buf [1024];
  char filename [1024];
  char lc_buf [1024];
  char hook [26] [32];
  char path [1024];
  
  uVar19 = (ulong)(uint)line;
  finder[0x40] = '\0';
  finder[0x41] = '\0';
  finder[0x42] = '\0';
  finder[0x43] = '\0';
  finder[0x44] = '\0';
  finder[0x45] = '\0';
  finder[0x46] = '\0';
  finder[0x47] = '\0';
  finder[0x48] = '\0';
  finder[0x49] = '\0';
  finder[0x4a] = '\0';
  finder[0x4b] = '\0';
  finder[0x4c] = '\0';
  finder[0x4d] = '\0';
  finder[0x4e] = '\0';
  finder[0x4f] = '\0';
  finder[0x30] = '\0';
  finder[0x31] = '\0';
  finder[0x32] = '\0';
  finder[0x33] = '\0';
  finder[0x34] = '\0';
  finder[0x35] = '\0';
  finder[0x36] = '\0';
  finder[0x37] = '\0';
  finder[0x38] = '\0';
  finder[0x39] = '\0';
  finder[0x3a] = '\0';
  finder[0x3b] = '\0';
  finder[0x3c] = '\0';
  finder[0x3d] = '\0';
  finder[0x3e] = '\0';
  finder[0x3f] = '\0';
  finder[0x20] = '\0';
  finder[0x21] = '\0';
  finder[0x22] = '\0';
  finder[0x23] = '\0';
  finder[0x24] = '\0';
  finder[0x25] = '\0';
  finder[0x26] = '\0';
  finder[0x27] = '\0';
  finder[0x28] = '\0';
  finder[0x29] = '\0';
  finder[0x2a] = '\0';
  finder[0x2b] = '\0';
  finder[0x2c] = '\0';
  finder[0x2d] = '\0';
  finder[0x2e] = '\0';
  finder[0x2f] = '\0';
  finder[0x10] = '\0';
  finder[0x11] = '\0';
  finder[0x12] = '\0';
  finder[0x13] = '\0';
  finder[0x14] = '\0';
  finder[0x15] = '\0';
  finder[0x16] = '\0';
  finder[0x17] = '\0';
  finder[0x18] = '\0';
  finder[0x19] = '\0';
  finder[0x1a] = '\0';
  finder[0x1b] = '\0';
  finder[0x1c] = '\0';
  finder[0x1d] = '\0';
  finder[0x1e] = '\0';
  finder[0x1f] = '\0';
  finder[0] = '\0';
  finder[1] = '\0';
  finder[2] = '\0';
  finder[3] = '\0';
  finder[4] = '\0';
  finder[5] = '\0';
  finder[6] = '\0';
  finder[7] = '\0';
  finder[8] = '\0';
  finder[9] = '\0';
  finder[10] = '\0';
  finder[0xb] = '\0';
  finder[0xc] = '\0';
  finder[0xd] = '\0';
  finder[0xe] = '\0';
  finder[0xf] = '\0';
  shower[0x40] = '\0';
  shower[0x41] = '\0';
  shower[0x42] = '\0';
  shower[0x43] = '\0';
  shower[0x44] = '\0';
  shower[0x45] = '\0';
  shower[0x46] = '\0';
  shower[0x47] = '\0';
  shower[0x48] = '\0';
  shower[0x49] = '\0';
  shower[0x4a] = '\0';
  shower[0x4b] = '\0';
  shower[0x4c] = '\0';
  shower[0x4d] = '\0';
  shower[0x4e] = '\0';
  shower[0x4f] = '\0';
  shower[0x30] = '\0';
  shower[0x31] = '\0';
  shower[0x32] = '\0';
  shower[0x33] = '\0';
  shower[0x34] = '\0';
  shower[0x35] = '\0';
  shower[0x36] = '\0';
  shower[0x37] = '\0';
  shower[0x38] = '\0';
  shower[0x39] = '\0';
  shower[0x3a] = '\0';
  shower[0x3b] = '\0';
  shower[0x3c] = '\0';
  shower[0x3d] = '\0';
  shower[0x3e] = '\0';
  shower[0x3f] = '\0';
  shower[0x20] = '\0';
  shower[0x21] = '\0';
  shower[0x22] = '\0';
  shower[0x23] = '\0';
  shower[0x24] = '\0';
  shower[0x25] = '\0';
  shower[0x26] = '\0';
  shower[0x27] = '\0';
  shower[0x28] = '\0';
  shower[0x29] = '\0';
  shower[0x2a] = '\0';
  shower[0x2b] = '\0';
  shower[0x2c] = '\0';
  shower[0x2d] = '\0';
  shower[0x2e] = '\0';
  shower[0x2f] = '\0';
  shower[0x10] = '\0';
  shower[0x11] = '\0';
  shower[0x12] = '\0';
  shower[0x13] = '\0';
  shower[0x14] = '\0';
  shower[0x15] = '\0';
  shower[0x16] = '\0';
  shower[0x17] = '\0';
  shower[0x18] = '\0';
  shower[0x19] = '\0';
  shower[0x1a] = '\0';
  shower[0x1b] = '\0';
  shower[0x1c] = '\0';
  shower[0x1d] = '\0';
  shower[0x1e] = '\0';
  shower[0x1f] = '\0';
  shower[0] = '\0';
  shower[1] = '\0';
  shower[2] = '\0';
  shower[3] = '\0';
  shower[4] = '\0';
  shower[5] = '\0';
  shower[6] = '\0';
  shower[7] = '\0';
  shower[8] = '\0';
  shower[9] = '\0';
  shower[10] = '\0';
  shower[0xb] = '\0';
  shower[0xc] = '\0';
  shower[0xd] = '\0';
  shower[0xe] = '\0';
  shower[0xf] = '\0';
  caption[0x70] = '\0';
  caption[0x71] = '\0';
  caption[0x72] = '\0';
  caption[0x73] = '\0';
  caption[0x74] = '\0';
  caption[0x75] = '\0';
  caption[0x76] = '\0';
  caption[0x77] = '\0';
  caption[0x78] = '\0';
  caption[0x79] = '\0';
  caption[0x7a] = '\0';
  caption[0x7b] = '\0';
  caption[0x7c] = '\0';
  caption[0x7d] = '\0';
  caption[0x7e] = '\0';
  caption[0x7f] = '\0';
  caption[0x60] = '\0';
  caption[0x61] = '\0';
  caption[0x62] = '\0';
  caption[99] = '\0';
  caption[100] = '\0';
  caption[0x65] = '\0';
  caption[0x66] = '\0';
  caption[0x67] = '\0';
  caption[0x68] = '\0';
  caption[0x69] = '\0';
  caption[0x6a] = '\0';
  caption[0x6b] = '\0';
  caption[0x6c] = '\0';
  caption[0x6d] = '\0';
  caption[0x6e] = '\0';
  caption[0x6f] = '\0';
  caption[0x50] = '\0';
  caption[0x51] = '\0';
  caption[0x52] = '\0';
  caption[0x53] = '\0';
  caption[0x54] = '\0';
  caption[0x55] = '\0';
  caption[0x56] = '\0';
  caption[0x57] = '\0';
  caption[0x58] = '\0';
  caption[0x59] = '\0';
  caption[0x5a] = '\0';
  caption[0x5b] = '\0';
  caption[0x5c] = '\0';
  caption[0x5d] = '\0';
  caption[0x5e] = '\0';
  caption[0x5f] = '\0';
  caption[0x40] = '\0';
  caption[0x41] = '\0';
  caption[0x42] = '\0';
  caption[0x43] = '\0';
  caption[0x44] = '\0';
  caption[0x45] = '\0';
  caption[0x46] = '\0';
  caption[0x47] = '\0';
  caption[0x48] = '\0';
  caption[0x49] = '\0';
  caption[0x4a] = '\0';
  caption[0x4b] = '\0';
  caption[0x4c] = '\0';
  caption[0x4d] = '\0';
  caption[0x4e] = '\0';
  caption[0x4f] = '\0';
  caption[0x30] = '\0';
  caption[0x31] = '\0';
  caption[0x32] = '\0';
  caption[0x33] = '\0';
  caption[0x34] = '\0';
  caption[0x35] = '\0';
  caption[0x36] = '\0';
  caption[0x37] = '\0';
  caption[0x38] = '\0';
  caption[0x39] = '\0';
  caption[0x3a] = '\0';
  caption[0x3b] = '\0';
  caption[0x3c] = '\0';
  caption[0x3d] = '\0';
  caption[0x3e] = '\0';
  caption[0x3f] = '\0';
  caption[0x20] = '\0';
  caption[0x21] = '\0';
  caption[0x22] = '\0';
  caption[0x23] = '\0';
  caption[0x24] = '\0';
  caption[0x25] = '\0';
  caption[0x26] = '\0';
  caption[0x27] = '\0';
  caption[0x28] = '\0';
  caption[0x29] = '\0';
  caption[0x2a] = '\0';
  caption[0x2b] = '\0';
  caption[0x2c] = '\0';
  caption[0x2d] = '\0';
  caption[0x2e] = '\0';
  caption[0x2f] = '\0';
  caption[0x10] = '\0';
  caption[0x11] = '\0';
  caption[0x12] = '\0';
  caption[0x13] = '\0';
  caption[0x14] = '\0';
  caption[0x15] = '\0';
  caption[0x16] = '\0';
  caption[0x17] = '\0';
  caption[0x18] = '\0';
  caption[0x19] = '\0';
  caption[0x1a] = '\0';
  caption[0x1b] = '\0';
  caption[0x1c] = '\0';
  caption[0x1d] = '\0';
  caption[0x1e] = '\0';
  caption[0x1f] = '\0';
  caption[0] = '\0';
  caption[1] = '\0';
  caption[2] = '\0';
  caption[3] = '\0';
  caption[4] = '\0';
  caption[5] = '\0';
  caption[6] = '\0';
  caption[7] = '\0';
  caption[8] = '\0';
  caption[9] = '\0';
  caption[10] = '\0';
  caption[0xb] = '\0';
  caption[0xc] = '\0';
  caption[0xd] = '\0';
  caption[0xe] = '\0';
  caption[0xf] = '\0';
  for (lVar8 = 0; lVar8 != 0x340; lVar8 = lVar8 + 0x20) {
    hook[0][lVar8] = '\0';
  }
  local_14f8 = mode;
  Term_get_size(&wid,&hgt);
  my_strcpy(filename,name,0x400);
  sVar9 = strlen(filename);
  pcVar14 = (char *)0x0;
  pcVar10 = (char *)(sVar9 & 0xffffffff);
  if ((int)sVar9 < 1) {
    pcVar10 = pcVar14;
  }
  pcVar13 = (char *)0x0;
  do {
    if (pcVar10 == pcVar13) goto LAB_001c319e;
    pcVar1 = pcVar13 + 1;
    pcVar2 = filename + (long)pcVar13;
    pcVar13 = pcVar1;
  } while (*pcVar2 != '#');
  pcVar14 = filename + (long)pcVar1;
  (buf + 0x3ff)[(long)pcVar1] = '\0';
LAB_001c319e:
  if (what != (char *)0x0) {
    my_strcpy(caption,what,0x80);
    my_strcpy(path,filename,0x400);
    local_1518 = file_open(path,MODE_READ,FTYPE_TEXT);
    if (local_1518 != (ang_file *)0x0) goto LAB_001c324f;
  }
  strnfmt(caption,0x80,"Help file \'%s\'",filename);
  path_build(path,0x400,ANGBAND_DIR_HELP,filename);
  local_1518 = file_open(path,MODE_READ,FTYPE_TEXT);
  if (local_1518 == (ang_file *)0x0) {
    msg("Cannot open \'%s\'.",filename);
    event_signal(EVENT_MESSAGE_FLUSH);
    return true;
  }
LAB_001c324f:
  local_1508 = 0;
  local_1510 = 0;
  do {
    bVar16 = false;
    while( true ) {
      while( true ) {
        _Var5 = file_getl(local_1518,buf,0x400);
        if (!_Var5) {
          local_14f0 = (int)local_1508 + 4;
          uVar17 = local_1508 & 0xffffffff;
          local_14f4 = 0;
          local_1500 = 0;
          pcVar10 = (char *)0x0;
          goto LAB_001c33a3;
        }
        if (!bVar16) break;
        _Var5 = contains_only_spaces(buf);
        bVar16 = !_Var5;
      }
      _Var5 = prefix(buf,".. ");
      if (!_Var5) break;
      _Var5 = prefix(buf + 3,"menu:: [");
      if ((_Var5) && (buf[0xc] == ']')) {
        local_1510 = (uint)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
        bVar16 = true;
        if ((byte)(buf[0xb] + 0x9fU) < 0x1a) {
          my_strcpy(hook[(byte)buf[0xb] - 0x61],buf + 0xe,0x20);
          bVar16 = true;
        }
      }
      else {
        bVar16 = true;
        if (buf[3] == '_' && pcVar14 != (char *)0x0) {
          sVar9 = strlen(buf);
          buf[sVar9 - 1] = '\0';
          iVar6 = strcmp(buf + 4,pcVar14);
          if (iVar6 == 0) {
            uVar19 = local_1508 & 0xffffffff;
          }
          bVar16 = true;
        }
      }
    }
    local_1508 = (ulong)((int)local_1508 + 1);
  } while( true );
LAB_001c33a3:
  uVar19 = uVar19 & 0xffffffff;
  do {
    Term_clear();
    uVar7 = local_14f0 - hgt;
    if ((int)(uint)uVar19 < local_14f0 - hgt) {
      uVar7 = (uint)uVar19;
    }
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    uVar19 = (ulong)uVar7;
    if ((int)uVar7 < (int)uVar17) {
      file_close(local_1518);
      local_1518 = file_open(path,MODE_READ,FTYPE_TEXT);
      if (local_1518 == (ang_file *)0x0) {
        return true;
      }
      uVar17 = 0;
    }
    bVar16 = false;
    bVar3 = bVar16;
    while ((bVar4 = bVar3, (int)uVar17 < (int)uVar7 &&
           (_Var5 = file_getl(local_1518,buf,0x400), bVar4 = bVar16, _Var5))) {
      if (bVar16) {
        _Var5 = contains_only_spaces(buf);
        if (_Var5) {
          bVar16 = false;
        }
      }
      else {
        _Var5 = prefix(buf,".. ");
        uVar17 = (ulong)((int)uVar17 + (uint)!_Var5);
        bVar3 = bVar16;
        if (_Var5) {
          bVar16 = true;
          bVar3 = bVar16;
        }
      }
    }
    iVar6 = 0;
LAB_001c346a:
    iVar12 = iVar6;
    bVar16 = bVar4;
    if (iVar12 < hgt + -4) {
      if (iVar12 == 0) {
        uVar19 = uVar17;
      }
      _Var5 = file_getl(local_1518,buf,0x400);
      if (!_Var5) goto LAB_001c35b3;
      iVar6 = iVar12;
      if (bVar16) {
        _Var5 = contains_only_spaces(buf);
        bVar4 = bVar16;
        if (_Var5) {
          bVar4 = false;
        }
      }
      else {
        _Var5 = prefix(buf,".. ");
        bVar4 = true;
        if (!_Var5) {
          my_strcpy(lc_buf,buf,0x400);
          if ((local_1500 & 1) == 0) {
            string_lower(lc_buf);
          }
          uVar17 = (ulong)((int)uVar17 + 1);
          if ((pcVar10 != (char *)0x0) && (iVar12 == 0)) {
            pcVar14 = strstr(lc_buf,pcVar10);
            bVar4 = bVar16;
            iVar6 = 0;
            if (pcVar14 == (char *)0x0) goto LAB_001c346a;
          }
          local_150c = iVar12 + L'\x02';
          Term_putstr(L'\0',local_150c,L'\xffffffff',L'\x01',buf);
          if (shower[0] != '\0') {
            pcVar10 = lc_buf;
            while (pcVar10 = strstr(pcVar10,shower), pcVar10 != (char *)0x0) {
              local_1528 = pcVar10;
              local_1520 = strlen(shower);
              Term_putstr((wchar_t)((long)local_1528 - (long)lc_buf),local_150c,(wchar_t)local_1520,
                          L'\v',buf + ((long)local_1528 - (long)lc_buf));
              pcVar10 = local_1528 + (int)local_1520;
            }
          }
          pcVar10 = (char *)0x0;
          bVar4 = bVar16;
          iVar6 = iVar12 + 1;
        }
      }
      goto LAB_001c346a;
    }
LAB_001c35b3:
    if (pcVar10 == (char *)0x0) break;
    bell();
    pcVar10 = (char *)0x0;
    uVar19 = (ulong)local_14f4;
  } while( true );
  uVar7 = (uint)uVar19;
  wVar18 = uVar7 + L'\xfffffffc';
  iVar6 = (int)local_1508;
  pcVar10 = format("[%s, %s, Line %d-%d/%d]",buildid,caption,uVar19,(ulong)(uint)(hgt + wVar18),
                   local_1508 & 0xffffffff);
  prt(pcVar10,L'\0',L'\0');
  if ((local_1510 & 1) == 0) {
    if (hgt + -4 < iVar6) {
      pcVar10 = "[Press Space to advance, or ESC to exit.]";
    }
    else {
      pcVar10 = "[Press ESC to exit.]";
    }
  }
  else {
    pcVar10 = "[Press a Letter, or ESC to exit.]";
  }
  prt(pcVar10,hgt + L'\xffffffff',L'\0');
  kVar22 = inkey();
  uStack_1540 = kVar22._0_8_ >> 0x20;
  uVar20 = uStack_1540 != 0x3f;
  if (uStack_1540 == 0x3f) goto LAB_001c397c;
  bVar21 = uStack_1540 == 0x21;
  if (uStack_1540 == 0x23) {
    local_1528 = (char *)CONCAT71(local_1528._1_7_,bVar21);
    ftmp[8] = '\0';
    ftmp[9] = '\0';
    ftmp[10] = '\0';
    ftmp[0xb] = '\0';
    ftmp[0xc] = '\0';
    ftmp[0xd] = '\0';
    ftmp[0xe] = '\0';
    ftmp[0xf] = '\0';
    ftmp[0x40] = '\0';
    ftmp[0x41] = '\0';
    ftmp[0x42] = '\0';
    ftmp[0x43] = '\0';
    ftmp[0x44] = '\0';
    ftmp[0x45] = '\0';
    ftmp[0x46] = '\0';
    ftmp[0x47] = '\0';
    ftmp[0x48] = '\0';
    ftmp[0x49] = '\0';
    ftmp[0x4a] = '\0';
    ftmp[0x4b] = '\0';
    ftmp[0x4c] = '\0';
    ftmp[0x4d] = '\0';
    ftmp[0x4e] = '\0';
    ftmp[0x4f] = '\0';
    ftmp[0x30] = '\0';
    ftmp[0x31] = '\0';
    ftmp[0x32] = '\0';
    ftmp[0x33] = '\0';
    ftmp[0x34] = '\0';
    ftmp[0x35] = '\0';
    ftmp[0x36] = '\0';
    ftmp[0x37] = '\0';
    ftmp[0x38] = '\0';
    ftmp[0x39] = '\0';
    ftmp[0x3a] = '\0';
    ftmp[0x3b] = '\0';
    ftmp[0x3c] = '\0';
    ftmp[0x3d] = '\0';
    ftmp[0x3e] = '\0';
    ftmp[0x3f] = '\0';
    ftmp[0x20] = '\0';
    ftmp[0x21] = '\0';
    ftmp[0x22] = '\0';
    ftmp[0x23] = '\0';
    ftmp[0x24] = '\0';
    ftmp[0x25] = '\0';
    ftmp[0x26] = '\0';
    ftmp[0x27] = '\0';
    ftmp[0x28] = '\0';
    ftmp[0x29] = '\0';
    ftmp[0x2a] = '\0';
    ftmp[0x2b] = '\0';
    ftmp[0x2c] = '\0';
    ftmp[0x2d] = '\0';
    ftmp[0x2e] = '\0';
    ftmp[0x2f] = '\0';
    ftmp[0x10] = '\0';
    ftmp[0x11] = '\0';
    ftmp[0x12] = '\0';
    ftmp[0x13] = '\0';
    ftmp[0x14] = '\0';
    ftmp[0x15] = '\0';
    ftmp[0x16] = '\0';
    ftmp[0x17] = '\0';
    ftmp[0x18] = '\0';
    ftmp[0x19] = '\0';
    ftmp[0x1a] = '\0';
    ftmp[0x1b] = '\0';
    ftmp[0x1c] = '\0';
    ftmp[0x1d] = '\0';
    ftmp[0x1e] = '\0';
    ftmp[0x1f] = '\0';
    ftmp[0] = '0';
    ftmp[1] = '\0';
    ftmp[2] = '\0';
    ftmp[3] = '\0';
    ftmp[4] = '\0';
    ftmp[5] = '\0';
    ftmp[6] = '\0';
    ftmp[7] = '\0';
    prt("Goto Line: ",hgt + L'\xffffffff',L'\0');
    _Var5 = askfor_aux(ftmp,0x50,
                       (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
    if (_Var5) {
      uVar7 = atoi(ftmp);
      uVar19 = (ulong)uVar7;
    }
    uStack_1540 = 0x23;
LAB_001c38d5:
    pcVar10 = (char *)0x0;
  }
  else {
    kVar15 = kVar22.code;
    if (kVar15 == 0x25) {
      local_1528 = (char *)CONCAT71(local_1528._1_7_,bVar21);
      local_1520 = CONCAT71(local_1520._1_7_,uVar20);
      pcVar10 = "index.txt";
      if ((player->opts).opt[1] != false) {
        pcVar10 = "r_index.txt";
      }
      local_150c = wVar18;
      my_strcpy(ftmp,pcVar10,0x50);
      prt("Goto File: ",hgt + L'\xffffffff',L'\0');
      _Var5 = askfor_aux(ftmp,0x50,
                         (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
      uStack_1540 = 0x25;
      if (_Var5) {
        _Var5 = show_file(ftmp,(char *)0x0,0,local_14f8);
        uStack_1540 = 0xe000;
        if (_Var5) {
          uStack_1540 = 0x25;
        }
      }
      wVar18 = local_150c;
      uVar20 = (undefined1)local_1520;
      bVar21 = (byte)local_1528;
LAB_001c376f:
      iVar6 = (int)uStack_1540;
      switch(iVar6) {
      case 0x2d:
      case 0x39:
switchD_001c38c9_caseD_95:
        uVar19 = (ulong)((uVar7 - hgt) + 4);
        break;
      case 0x2e:
      case 0x2f:
      case 0x30:
      case 0x34:
      case 0x35:
      case 0x36:
        break;
      case 0x31:
switchD_001c38c9_caseD_96:
        pcVar10 = (char *)0x0;
        uVar19 = local_1508;
        goto LAB_001c390c;
      case 0x32:
switchD_001c38c9_caseD_9c:
        uVar19 = (ulong)(uVar7 + 1);
        break;
      case 0x33:
switchD_001c38c9_caseD_97:
        pcVar10 = (char *)0x0;
        uVar19 = (ulong)(uint)(wVar18 + hgt);
        goto LAB_001c390c;
      case 0x37:
switchD_001c38c9_caseD_94:
        pcVar10 = (char *)0x0;
        uVar19 = 0;
        goto LAB_001c390c;
      case 0x38:
        goto switchD_001c38b4_caseD_38;
      default:
        switch(iVar6) {
        case 0x94:
          goto switchD_001c38c9_caseD_94;
        case 0x95:
          goto switchD_001c38c9_caseD_95;
        case 0x96:
          goto switchD_001c38c9_caseD_96;
        case 0x97:
          goto switchD_001c38c9_caseD_97;
        case 0x98:
        case 0x99:
        case 0x9a:
        case 0x9b:
          break;
        case 0x9c:
          goto switchD_001c38c9_caseD_9c;
        default:
          if (iVar6 == 0x20) goto switchD_001c38c9_caseD_97;
          if (iVar6 == 0x6a) goto switchD_001c38c9_caseD_9c;
          if (iVar6 != 0x83) {
            if (iVar6 == 0x80) goto switchD_001c38c9_caseD_9c;
            if (iVar6 != 0x6b) break;
          }
switchD_001c38b4_caseD_38:
          uVar19 = (ulong)(uVar7 - 1);
        }
      }
      pcVar10 = (char *)0x0;
      goto LAB_001c390c;
    }
    if (kVar15 == 0x2f) {
      local_1528 = (char *)CONCAT71(local_1528._1_7_,bVar21);
      prt("Find: ",hgt + L'\xffffffff',L'\0');
      _Var5 = askfor_aux(finder,0x50,
                         (_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0);
      if (!_Var5) {
        uStack_1540 = 0x2f;
        goto LAB_001c38d5;
      }
      local_1520 = CONCAT71(local_1520._1_7_,uVar20);
      if ((local_1500 & 1) == 0) {
        string_lower(finder);
      }
      pcVar10 = finder;
      my_strcpy(shower,pcVar10,0x50);
      uStack_1540 = 0x2f;
      uVar19 = (ulong)(uVar7 + 1);
      local_14f4 = uVar7;
    }
    else {
      if (kVar15 != 0x26) goto LAB_001c376f;
      local_1528 = (char *)CONCAT71(local_1528._1_7_,bVar21);
      local_1520 = CONCAT71(local_1520._1_7_,uVar20);
      prt("Show: ",hgt + L'\xffffffff',L'\0');
      askfor_aux(shower,0x50,(_func__Bool_char_ptr_size_t_size_t_ptr_size_t_ptr_keypress__Bool *)0x0
                );
      if ((local_1500 & 1) == 0) {
        string_lower(shower);
      }
      uStack_1540 = 0x26;
      pcVar10 = (char *)0x0;
    }
    uVar20 = (undefined1)local_1520;
  }
  bVar21 = (byte)local_1528;
LAB_001c390c:
  local_1500 = CONCAT71((int7)(local_1500 >> 8),(byte)local_1500 ^ bVar21);
  if ((((local_1510 & 1) == 0) ||
      (ppuVar11 = __ctype_b_loc(),
      (*(byte *)((long)*ppuVar11 + (uStack_1540 & 0xff) * 2 + 1) & 4) == 0)) ||
     (uVar7 = (int)uStack_1540 - 0x61, 0x19 < uVar7)) {
    if ((int)uStack_1540 == 0xe000) {
LAB_001c397c:
      file_close(local_1518);
      return (_Bool)uVar20;
    }
  }
  else if ((hook[uVar7][0] != '\0') &&
          (_Var5 = show_file(hook[uVar7],(char *)0x0,0,local_14f8), !_Var5)) goto LAB_001c397c;
  goto LAB_001c33a3;
}

Assistant:

bool show_file(const char *name, const char *what, int line, int mode)
{
	int i, k, n;

	struct keypress ch = KEYPRESS_NULL;

	/* Number of "real" lines passed by */
	int next = 0;

	/* Number of "real" lines in the file */
	int size;

	/* Backup value for "line" */
	int back = 0;

	/* This screen has sub-screens */
	bool menu = false;

	/* Case sensitive search */
	bool case_sensitive = false;

	/* Current help file */
	ang_file *fff = NULL;

	/* Find this string (if any) */
	char *find = NULL;

	/* Jump to this tag */
	const char *tag = NULL;

	/* Hold a string to find */
	char finder[80] = "";

	/* Hold a string to show */
	char shower[80] = "";

	/* Filename */
	char filename[1024];

	/* Describe this thing */
	char caption[128] = "";

	/* Path buffer */
	char path[1024];

	/* General buffer */
	char buf[1024];

	/* Lower case version of the buffer, for searching */
	char lc_buf[1024];

	/* Sub-menu information */
	char hook[26][32];

	int wid, hgt;
	
	/* true if we are inside a RST block that should be skipped */
	bool skip_lines = false;



	/* Wipe the hooks */
	for (i = 0; i < 26; i++) hook[i][0] = '\0';

	/* Get size */
	Term_get_size(&wid, &hgt);

	/* Copy the filename */
	my_strcpy(filename, name, sizeof(filename));

	n = strlen(filename);

	/* Extract the tag from the filename */
	for (i = 0; i < n; i++) {
		if (filename[i] == '#') {
			filename[i] = '\0';
			tag = filename + i + 1;
			break;
		}
	}

	/* Redirect the name */
	name = filename;

	/* Currently unused facility to show and describe arbitrary files */
	if (what) {
		my_strcpy(caption, what, sizeof(caption));

		my_strcpy(path, name, sizeof(path));
		fff = file_open(path, MODE_READ, FTYPE_TEXT);
	}

	/* Look in "help" */
	if (!fff) {
		strnfmt(caption, sizeof(caption), "Help file '%s'", name);

		path_build(path, sizeof(path), ANGBAND_DIR_HELP, name);
		fff = file_open(path, MODE_READ, FTYPE_TEXT);
	}

	/* Oops */
	if (!fff) {
		/* Message */
		msg("Cannot open '%s'.", name);
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Oops */
		return (true);
	}


	/* Pre-Parse the file */
	while (true) {
		/* Read a line or stop */
		if (!file_getl(fff, buf, sizeof(buf))) break;

		/* Skip lines if we are inside a RST directive */
		if (skip_lines){
			if (contains_only_spaces(buf))
				skip_lines = false;
			continue;
		}

		/* Parse a very small subset of RST */
		/* TODO: should be more flexible */
		if (prefix(buf, ".. ")) {
			/* parse ".. menu:: [x] filename.txt" (with exact spacing)*/
			if (prefix(buf+strlen(".. "), "menu:: [") && 
                           buf[strlen(".. menu:: [x")]==']') {
				/* This is a menu file */
				menu = true;

				/* Extract the menu item */
				k = A2I(buf[strlen(".. menu:: [")]);

				/* Store the menu item (if valid) */
				if ((k >= 0) && (k < 26))
					my_strcpy(hook[k], buf + strlen(".. menu:: [x] "),
							  sizeof(hook[0]));
			} else if (buf[strlen(".. ")] == '_') {
				/* parse ".. _some_hyperlink_target:" */
				if (tag) {
					/* Remove the closing '>' of the tag */
					buf[strlen(buf) - 1] = '\0';

					/* Compare with the requested tag */
					if (streq(buf + strlen(".. _"), tag)) {
						/* Remember the tagged line */
						line = next;
					}
				}
			}

			/* Skip this and enter skip mode*/
			skip_lines = true;
			continue;
		}

		/* Count the "real" lines */
		next++;
	}

	/* Save the number of "real" lines */
	size = next;


	/* Display the file */
	while (true) {
		/* Clear screen */
		Term_clear();


		/* Restrict the visible range */
		if (line > (size - (hgt - 4))) line = size - (hgt - 4);
		if (line < 0) line = 0;

		skip_lines = false;

		/* Re-open the file if needed */
		if (next > line) {
			/* Close it */
			file_close(fff);

			/* Hack -- Re-Open the file */
			fff = file_open(path, MODE_READ, FTYPE_TEXT);
			if (!fff) return (true);

			/* File has been restarted */
			next = 0;
		}


		/* Goto the selected line */
		while (next < line) {
			/* Get a line */
			if (!file_getl(fff, buf, sizeof(buf))) break;

			/* Skip lines if we are inside a RST directive*/
			if (skip_lines) {
				if (contains_only_spaces(buf))
					skip_lines=false;
				continue;
			}

			/* Skip RST directives */
			if (prefix(buf, ".. ")) {
				skip_lines=true;
				continue;
			}

			/* Count the lines */
			next++;
		}


		/* Dump the next lines of the file */
		for (i = 0; i < hgt - 4; ) {
			/* Hack -- track the "first" line */
			if (!i) line = next;

			/* Get a line of the file or stop */
			if (!file_getl(fff, buf, sizeof(buf))) break;

			/* Skip lines if we are inside a RST directive */
			if (skip_lines) {
				if (contains_only_spaces(buf))
					skip_lines = false;
				continue;
			}

			/* Skip RST directives */
			if (prefix(buf, ".. ")) {
				skip_lines=true;
				continue;
			}

			/* Count the "real" lines */
			next++;

			/* Make a copy of the current line for searching */
			my_strcpy(lc_buf, buf, sizeof(lc_buf));

			/* Make the line lower case */
			if (!case_sensitive) string_lower(lc_buf);

			/* Hack -- keep searching */
			if (find && !i && !strstr(lc_buf, find)) continue;

			/* Hack -- stop searching */
			find = NULL;

			/* Dump the line */
			Term_putstr(0, i+2, -1, COLOUR_WHITE, buf);

			/* Highlight "shower" */
			if (strlen(shower)) {
				const char *str = lc_buf;

				/* Display matches */
				while ((str = strstr(str, shower)) != NULL) {
					int len = strlen(shower);

					/* Display the match */
					Term_putstr(str-lc_buf, i+2, len, COLOUR_YELLOW,
								&buf[str-lc_buf]);

					/* Advance */
					str += len;
				}
			}

			/* Count the printed lines */
			i++;
		}

		/* Hack -- failed search */
		if (find) {
			bell();
			line = back;
			find = NULL;
			continue;
		}


		/* Show a general "title" */
		prt(format("[%s, %s, Line %d-%d/%d]", buildid,
		           caption, line, line + hgt - 4, size), 0, 0);


		/* Prompt */
		if (menu) {
			/* Menu screen */
			prt("[Press a Letter, or ESC to exit.]", hgt - 1, 0);
		} else if (size <= hgt - 4) {
			/* Small files */
			prt("[Press ESC to exit.]", hgt - 1, 0);
		} else {
			/* Large files */
			prt("[Press Space to advance, or ESC to exit.]", hgt - 1, 0);
		}

		/* Get a keypress */
		ch = inkey();

		/* Exit the help */
		if (ch.code == '?') break;

		/* Toggle case sensitive on/off */
		if (ch.code == '!')
			case_sensitive = !case_sensitive;

		/* Try showing */
		if (ch.code == '&') {
			/* Get "shower" */
			prt("Show: ", hgt - 1, 0);
			(void)askfor_aux(shower, sizeof(shower), NULL);

			/* Make the "shower" lowercase */
			if (!case_sensitive) string_lower(shower);
		}

		/* Try finding */
		if (ch.code == '/') {
			/* Get "finder" */
			prt("Find: ", hgt - 1, 0);
			if (askfor_aux(finder, sizeof(finder), NULL)) {
				/* Find it */
				find = finder;
				back = line;
				line = line + 1;

				/* Make the "finder" lowercase */
				if (!case_sensitive) string_lower(finder);

				/* Show it */
				my_strcpy(shower, finder, sizeof(shower));
			}
		}

		/* Go to a specific line */
		if (ch.code == '#') {
			char tmp[80] = "0";

			prt("Goto Line: ", hgt - 1, 0);
			if (askfor_aux(tmp, sizeof(tmp), NULL))
				line = atoi(tmp);
		}

		/* Go to a specific file */
		if (ch.code == '%') {
			char ftmp[80];

			if (OPT(player, rogue_like_commands)) {
				my_strcpy(ftmp, "r_index.txt", sizeof(ftmp));
			} else {
				my_strcpy(ftmp, "index.txt", sizeof(ftmp));
			}

			prt("Goto File: ", hgt - 1, 0);
			if (askfor_aux(ftmp, sizeof(ftmp), NULL)) {
				if (!show_file(ftmp, NULL, 0, mode))
					ch.code = ESCAPE;
			}
		}

		switch (ch.code) {
			/* up a line */
			case ARROW_UP:
			case 'k':
			case '8': line--; break;

			/* up a page */
			case KC_PGUP:
			case '9':
			case '-': line -= (hgt - 4); break;

			/* home */
			case KC_HOME:
			case '7': line = 0; break;

			/* down a line */
			case ARROW_DOWN:
			case '2':
			case 'j':
			case KC_ENTER: line++; break;

			/* down a page */
			case KC_PGDOWN:
			case '3':
			case ' ': line += hgt - 4; break;

			/* end */
			case KC_END:
			case '1': line = size; break;
		}

		/* Recurse on letters */
		if (menu && isalpha((unsigned char)ch.code)) {
			/* Extract the requested menu item */
			k = A2I(ch.code);

			/* Verify the menu item */
			if ((k >= 0) && (k <= 25) && hook[k][0]) {
				/* Recurse on that file */
				if (!show_file(hook[k], NULL, 0, mode)) ch.code = ESCAPE;
			}
		}

		/* Exit on escape */
		if (ch.code == ESCAPE) break;
	}

	/* Close the file */
	file_close(fff);

	/* Done */
	return (ch.code != '?');
}